

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  float *in_R8;
  float *in_R9;
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  float *in_stack_00000008;
  float denom;
  ImVec2 v2;
  ImVec2 v1;
  ImVec2 v0;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  IVar2 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x170906);
  IVar3 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x17091b);
  IVar4 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x170930);
  local_38 = IVar2.x;
  uStack_3c = IVar3.y;
  local_40 = IVar3.x;
  uStack_34 = IVar2.y;
  fVar1 = local_38 * uStack_3c + -(local_40 * uStack_34);
  local_48 = IVar4.x;
  uStack_44 = IVar4.y;
  *in_R9 = (local_48 * uStack_3c + -(local_40 * uStack_44)) / fVar1;
  *in_stack_00000008 = (local_38 * uStack_44 + -(local_48 * uStack_34)) / fVar1;
  *in_R8 = (1.0 - *in_R9) - *in_stack_00000008;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}